

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::TiledInputFile::multiPartInitialize(TiledInputFile *this,InputPartData *part)

{
  bool bVar1;
  undefined1 uVar2;
  ArgExc *this_00;
  undefined8 uVar3;
  long in_RSI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *unaff_retaddr;
  Header *in_stack_00000008;
  Header *in_stack_00000010;
  bool *in_stack_00000020;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000028;
  TileOffsets *in_stack_00000030;
  TiledInputFile *in_stack_00000040;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__x;
  
  __x = in_RDI;
  Header::type_abi_cxx11_((Header *)0xaad542);
  bVar1 = std::operator!=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (!bVar1) {
    (in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_finish[0x2e] = *(unsigned_long *)(in_RSI + 0x48);
    Header::operator=(in_stack_00000010,in_stack_00000008);
    *(undefined4 *)
     ((in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish + 0xe) = *(undefined4 *)(in_RSI + 0x40);
    *(undefined4 *)
     ((in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish + 0x26) = *(undefined4 *)(in_RSI + 0x3c);
    uVar2 = (**(code **)(**(long **)((in_RDI->
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     )._M_impl.super__Vector_impl_data._M_finish[0x2e] + 0x28) +
                        0x10))();
    *(undefined1 *)
     ((in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish + 0x2d) = uVar2;
    initialize(in_stack_00000040);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(unaff_retaddr,__x);
    TileOffsets::readFrom(in_stack_00000030,in_stack_00000028,in_stack_00000020);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_RDI);
    uVar3 = (**(code **)(**(long **)((in_RDI->
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     )._M_impl.super__Vector_impl_data._M_finish[0x2e] + 0x28) +
                        0x28))();
    *(undefined8 *)
     ((in_RDI->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish[0x2e] + 0x30) = uVar3;
    return;
  }
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(this_00,"Can\'t build a TiledInputFile from a type-mismatched part.");
  __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

void
TiledInputFile::multiPartInitialize(InputPartData* part)
{
    if (part->header.type() != TILEDIMAGE)
        throw IEX_NAMESPACE::ArgExc("Can't build a TiledInputFile from a type-mismatched part.");

    _data->_streamData = part->mutex;
    _data->header = part->header;
    _data->version = part->version;
    _data->partNumber = part->partNumber;
    _data->memoryMapped = _data->_streamData->is->isMemoryMapped();
    initialize();
    _data->tileOffsets.readFrom(part->chunkOffsets,_data->fileIsComplete);
    _data->_streamData->currentPosition = _data->_streamData->is->tellg();
}